

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
toml::detail::location<std::vector<char,_std::allocator<char>_>_>::location
          (location<std::vector<char,_std::allocator<char>_>_> *this,
          location<std::vector<char,_std::allocator<char>_>_> *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_0015d9f0;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (param_1->source_).
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var1 = (param_1->source_).
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->line_number_ = param_1->line_number_;
  (this->source_name_)._M_dataplus._M_p = (pointer)&(this->source_name_).field_2;
  pcVar2 = (param_1->source_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source_name_,pcVar2,pcVar2 + (param_1->source_name_)._M_string_length)
  ;
  (this->iter_)._M_current = (param_1->iter_)._M_current;
  return;
}

Assistant:

location(const location&) = default;